

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Mask __thiscall kj::anon_unknown_36::WebSocketImpl::Header::getMask(Header *this)

{
  byte bVar1;
  Mask MVar2;
  byte payloadLen;
  Header *this_local;
  
  if ((this->bytes[1] & 0x80) == 0) {
    Mask::Mask((Mask *)((long)&this_local + 4));
  }
  else {
    bVar1 = this->bytes[1] & 0x7f;
    if (bVar1 == 0x7f) {
      Mask::Mask((Mask *)((long)&this_local + 4),this->bytes + 10);
    }
    else if (bVar1 == 0x7e) {
      Mask::Mask((Mask *)((long)&this_local + 4),this->bytes + 4);
    }
    else {
      Mask::Mask((Mask *)((long)&this_local + 4),this->bytes + 2);
    }
  }
  MVar2.maskBytes[0] = this_local._4_1_;
  MVar2.maskBytes[1] = this_local._5_1_;
  MVar2.maskBytes[2] = this_local._6_1_;
  MVar2.maskBytes[3] = this_local._7_1_;
  return (Mask)MVar2.maskBytes;
}

Assistant:

Mask getMask() const {
      if (bytes[1] & USE_MASK_MASK) {
        byte payloadLen = bytes[1] & PAYLOAD_LEN_MASK;
        if (payloadLen == 127) {
          return Mask(bytes + 10);
        } else if (payloadLen == 126) {
          return Mask(bytes + 4);
        } else {
          return Mask(bytes + 2);
        }
      } else {
        return Mask();
      }
    }